

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

string * RPCMallocInfo_abi_cxx11_(void)

{
  FILE *__stream;
  string *in_RDI;
  long in_FS_OFFSET;
  FILE *f;
  string *rv;
  size_t size;
  char *ptr;
  allocator<char> *__a;
  size_t __n;
  allocator<char> *__s;
  string *this;
  allocator<char> *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  allocator<char> local_1a;
  allocator<char> local_19;
  size_t local_18;
  allocator<char> *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (allocator<char> *)0x0;
  local_18 = 0;
  this = in_RDI;
  __stream = open_memstream((char **)&local_10,&local_18);
  if (__stream != (FILE *)0x0) {
    malloc_info(0,__stream);
    fclose(__stream);
    if (local_10 != (allocator<char> *)0x0) {
      __s = &local_19;
      __a = local_10;
      __n = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(this,(char *)__s,__n,__a);
      std::allocator<char>::~allocator(&local_19);
      free(local_10);
      goto LAB_01381093;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0
             ,in_stack_ffffffffffffffb8);
  std::allocator<char>::~allocator(&local_1a);
LAB_01381093:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::string RPCMallocInfo()
{
    char *ptr = nullptr;
    size_t size = 0;
    FILE *f = open_memstream(&ptr, &size);
    if (f) {
        malloc_info(0, f);
        fclose(f);
        if (ptr) {
            std::string rv(ptr, size);
            free(ptr);
            return rv;
        }
    }
    return "";
}